

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlSetAttrItem::GenerateActionEngineCode
          (GdlSetAttrItem *this,GrcManager *pcman,uint32_t fxdRuleVersion,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbOutput,GdlRule *param_5,int irit,
          bool *pfSetInsertToFalse)

{
  bool bVar1;
  int iVar2;
  size_type_conflict sVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000008;
  int nIIndex;
  undefined4 in_stack_00000018;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  
  sVar3 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::size
                    ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)(in_RDI + 5)
                    );
  if ((sVar3 == 0) &&
     (((ulong)(in_stack_00000008->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
              ._M_impl.super__Vector_impl_data._M_start & 1) == 0)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_RDI,(value_type_conflict3 *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    iVar2 = *(int *)&in_RDI[4].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar2 < 0) {
      iVar2 = -(iVar2 + 1);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_RDI,(value_type_conflict3 *)CONCAT44(iVar2,in_stack_ffffffffffffffb8));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_RDI,(value_type_conflict3 *)CONCAT44(iVar2,in_stack_ffffffffffffffb8));
    if (((ulong)(in_stack_00000008->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start & 1) != 0) {
      GdlRuleItem::GenerateInsertEqualsFalse(in_RDI);
    }
    bVar1 = GenerateAttrSettingCode
                      ((GdlSetAttrItem *)param_5,(GrcManager *)CONCAT44(irit,in_stack_00000018),
                       nIIndex,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    *(bool *)&(in_stack_00000008->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
              ._M_impl.super__Vector_impl_data._M_start = bVar1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_RDI,(value_type_conflict3 *)CONCAT44(iVar2,in_stack_ffffffffffffffb8));
  }
  return;
}

Assistant:

void GdlSetAttrItem::GenerateActionEngineCode(GrcManager * pcman, uint32_t fxdRuleVersion,
	std::vector<gr::byte> & vbOutput,
	GdlRule * /*prule*/, int irit, bool * pfSetInsertToFalse)
{
	if (m_vpavs.size() == 0 && !*pfSetInsertToFalse)
		vbOutput.push_back(kopCopyNext);
	else
	{
		int nIIndex = m_nInputIndex;
		nIIndex = (nIIndex < 0) ? (nIIndex + 1) * -1 : nIIndex;

		vbOutput.push_back(kopPutCopy);
		vbOutput.push_back(0);
		if (*pfSetInsertToFalse)
			GenerateInsertEqualsFalse(vbOutput);
		*pfSetInsertToFalse = GenerateAttrSettingCode(pcman, fxdRuleVersion, vbOutput,
			irit, nIIndex);
		vbOutput.push_back(kopNext);
	}
}